

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void movingDoCommand(char *orientationName,double scoreBias,atom *allMovingAtoms,void *userdata)

{
  double *pdVar1;
  atom_t **ppaVar2;
  atomBins *bbins;
  atom *paVar3;
  undefined8 *puVar4;
  atom_t *paVar5;
  char *in_stack_ffffffffffffff48;
  region boundingBoxB;
  region nonMovingBB;
  
  if (allMovingAtoms != (atom *)0x0) {
    boundingBoxB.min.z = (allMovingAtoms->loc).z;
    boundingBoxB.min.x = (allMovingAtoms->loc).x;
    boundingBoxB.min.y = (allMovingAtoms->loc).y;
    boundingBoxB.max.x = (allMovingAtoms->loc).x;
    boundingBoxB.max.y = (allMovingAtoms->loc).y;
    boundingBoxB.max.z = (allMovingAtoms->loc).z;
    paVar5 = allMovingAtoms;
    do {
      updateBoundingBox(&paVar5->loc,&boundingBoxB);
      paVar5 = paVar5->next;
    } while (paVar5 != (atom_t *)0x0);
    pdVar1 = *(double **)((long)userdata + 0x28);
    nonMovingBB.min.z = pdVar1[2];
    nonMovingBB.min.x = *pdVar1;
    nonMovingBB.min.y = pdVar1[1];
    nonMovingBB.max.x = pdVar1[3];
    nonMovingBB.max.y = pdVar1[4];
    nonMovingBB.max.z = pdVar1[5];
    addBBox2BBox(&nonMovingBB,&boundingBoxB);
    bbins = binAtoms(allMovingAtoms,&boundingBoxB,'b',*(float *)((long)userdata + 0x38),
                     *(int *)((long)userdata + 4),3);
    if (bbins == (atomBins *)0x0 || *(long *)((long)userdata + 0x28) == 0) {
      halt("no atoms for autobondrot processing");
    }
    if (ImplicitH == '\0') {
      if (*userdata == 0) {
        for (puVar4 = *(undefined8 **)((long)userdata + 0x20); paVar5 = allMovingAtoms,
            puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4) {
          if (((*(uint *)(puVar4 + 5) >> 0x1c & 1) != 0) && (*(int *)((long)puVar4 + 0x2c) == 9)) {
            *(uint *)(puVar4 + 5) = *(uint *)(puVar4 + 5) | 0x10000;
          }
        }
        do {
          if ((((uint)paVar5->props >> 0x1c & 1) != 0) && (paVar5->elem == 9)) {
            paVar5->props = paVar5->props | 0x10000;
          }
          ppaVar2 = &paVar5->next;
          paVar5 = *ppaVar2;
        } while (*ppaVar2 != (atom_t *)0x0);
        in_stack_ffffffffffffff48 = (char *)0x0;
        updateHydrogenInfo(*(FILE **)((long)userdata + 8),*(atom **)((long)userdata + 0x20),
                           *(atomBins **)((long)userdata + 0x28),allMovingAtoms,bbins,3,0);
      }
      else {
        in_stack_ffffffffffffff48 = (char *)0x1;
        paVar3 = updateHydrogenInfo(*(FILE **)((long)userdata + 8),*(atom **)((long)userdata + 0x18)
                                    ,*(atomBins **)((long)userdata + 0x28),allMovingAtoms,bbins,3,1)
        ;
        *(atom **)((long)userdata + 0x20) = paVar3;
        *(undefined4 *)userdata = 0;
      }
    }
    doCommand(*(FILE **)((long)userdata + 8),*(int *)((long)userdata + 0x10),
              *(atom **)((long)userdata + 0x18),*(atomBins **)((long)userdata + 0x28),allMovingAtoms
              ,bbins,*(pointSet **)((long)userdata + 0x30),*(float *)((long)userdata + 0x38),
              *(float *)((long)userdata + 0x3c),*(float *)((long)userdata + 0x40),
              *(int *)((long)userdata + 0x44),*(int *)((long)userdata + 0x48),0,orientationName,
              scoreBias,*(int *)((long)userdata + 0x4c),*(int *)((long)userdata + 0x50),
              *(char **)((long)userdata + 0x58),*(int *)((long)userdata + 0x60),
              *(char ***)((long)userdata + 0x68),in_stack_ffffffffffffff48);
    disposeBins(bbins);
  }
  return;
}

Assistant:

void movingDoCommand(char* orientationName, double scoreBias,
		  atom *allMovingAtoms, void *userdata)
{/*movingDoCommand() for autobondrot*/
   /*orientationName holds the angle values as a character string*/

/* NOTE: allMainAtoms/abins & allMovingAtoms/bbins must be disjoint */
/*       sets of atoms (none in common) or allMovingAtoms/bbins can */
/*       be NULL.                                                   */
/*       allMovingAtoms refers to autobondrot set of atoms          */

   movingCommandInfo *m = (movingCommandInfo *)userdata;
   region boundingBoxB, nonMovingBB;
   atom *a = NULL;
   atomBins *bbins = NULL;

   /*autobondrot.c: alst == atom *allMovingAtoms existance implies autobondrot*/
   if (allMovingAtoms) {
      boundingBoxB.min = allMovingAtoms->loc;
      boundingBoxB.max = allMovingAtoms->loc;
      for(a = allMovingAtoms; a; a = a->next) {
	 updateBoundingBox(&(a->loc), &boundingBoxB);
      }

      /* Expand bounding box because of extra water hydrogens */
      /*                        added in updateHydrogenInfo() */
      nonMovingBB.min = m->abins->min;
      nonMovingBB.max = m->abins->max;
      addBBox2BBox(&nonMovingBB, &boundingBoxB);

      bbins = binAtoms(allMovingAtoms, &boundingBoxB, 'b', m->probeRad,
			m->keepUnselected, SET1|SET2);

      if (m->abins == NULL || bbins == NULL) {
	 halt("no atoms for autobondrot processing");
      }

      if (! ImplicitH) {
	 if (m->firstPass) {
	    m->waterClones = updateHydrogenInfo(m->outf, m->allMainAtoms,
                             m->abins, allMovingAtoms, bbins, SET1|SET2, TRUE);
	    m->firstPass = FALSE;
	 }
	 else {
	    /*the DONOR prop tells updateHydrogenInfo() to build H? atoms*/
	    for(a = m->waterClones; a; a = a->next) {
	       if ((a->props & AMBIGWATER_PROP) && (a->elem == atomO)) {
		  a->props |= DONOR_PROP; /* turn water donor property back on*/
	       }
	    } /* since each pass through updateHydrogenInfo turns it off */

	    for(a = allMovingAtoms; a; a = a->next) {
	       if ((a->props & AMBIGWATER_PROP) && (a->elem == atomO)) {
		  a->props |= DONOR_PROP; /* turn water donor property back on*/
	       }
	    } /* since each pass through updateHydrogenInfo turns it off */

	    updateHydrogenInfo(m->outf, m->waterClones, m->abins,
	       allMovingAtoms, bbins, SET1|SET2, FALSE);
	 }
      }

      /*autobondrot at this stage has m->method == INTERSECTONCE == 1 */
      /* or m->method == SELFINTERSECT == 3 (seems as given in probe command)*/
      /* and m->countDots==1, m->rawOutput==1, m->drawSpike==1 */
      /* orientationName==rawname== char* holding angle values */

      doCommand(m->outf, m->method,
	 m->allMainAtoms, m->abins,
	 allMovingAtoms, bbins,
	 m->dots, m->probeRad, m->density, m->spikelen,
	 m->countDots, m->rawOutput, FALSE, orientationName, scoreBias,
	 m->drawSpike, m->sayGroup, m->groupLabel,
	 m->argc, m->argv, m->message); // SJ -10/07/2011 by default no condensed output for this

         /*allMovingAtoms is closest thing to a flag for autobondrot mode*/

      disposeBins(bbins);
   }
}